

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cc
# Opt level: O2

void __thiscall Text::Text(Text *this)

{
  uint in_EAX;
  initializer_list<unsigned_int> __l;
  undefined8 uStack_18;
  
  (this->content)._M_dataplus._M_p = (pointer)&(this->content).field_2;
  (this->content)._M_string_length = 0;
  (this->content).field_2._M_local_buf[0] = L'\0';
  uStack_18 = (ulong)in_EAX;
  __l._M_len = 1;
  __l._M_array = (iterator)((long)&uStack_18 + 4);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->line_offsets,__l,(allocator_type *)((long)&uStack_18 + 3));
  return;
}

Assistant:

Text::Text() : line_offsets{0} {}